

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run(void)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  FlagSaver fs;
  CommandLineFlagInfo info;
  CommandLineFlagInfo local_100;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineFlagInfoOrDieTest","FlagExistsAndIsDefault")
  ;
  info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
  info.name._M_string_length = 0;
  info.name.field_2._M_local_buf[0] = '\0';
  info.type._M_dataplus._M_p = (pointer)&info.type.field_2;
  info.type._M_string_length = 0;
  info.type.field_2._M_local_buf[0] = '\0';
  info.description._M_dataplus._M_p = (pointer)&info.description.field_2;
  info.description._M_string_length = 0;
  info.description.field_2._M_local_buf[0] = '\0';
  info.current_value._M_dataplus._M_p = (pointer)&info.current_value.field_2;
  info.current_value._M_string_length = 0;
  info.current_value.field_2._M_local_buf[0] = '\0';
  info.default_value._M_dataplus._M_p = (pointer)&info.default_value.field_2;
  info.default_value._M_string_length = 0;
  info.default_value.field_2._M_local_buf[0] = '\0';
  info.filename._M_dataplus._M_p = (pointer)&info.filename.field_2;
  info.filename._M_string_length = 0;
  info.filename.field_2._M_local_buf[0] = '\0';
  GetCommandLineFlagInfoOrDie(&local_100,"test_int32");
  CommandLineFlagInfo::operator=(&info,&local_100);
  CommandLineFlagInfo::~CommandLineFlagInfo(&local_100);
  bVar1 = std::operator==("test_int32",&info.name);
  if (bVar1) {
    bVar1 = std::operator==("int32",&info.type);
    if (bVar1) {
      bVar1 = std::operator==("",&info.description);
      if (bVar1) {
        bVar1 = std::operator==("-1",&info.current_value);
        if (bVar1) {
          bVar1 = std::operator==("-1",&info.default_value);
          if (bVar1) {
            if (info.is_default == false) {
LAB_00138052:
              pcVar2 = "info.is_default";
            }
            else {
              if ((undefined4 *)info.flag_ptr != &fLI::FLAGS_test_int32) {
                pcVar2 = "&FLAGS_test_int32";
LAB_0013809b:
                pcVar3 = "info.flag_ptr";
                goto LAB_001380a9;
              }
              GetCommandLineFlagInfoOrDie(&local_100,"test_bool");
              CommandLineFlagInfo::operator=(&info,&local_100);
              CommandLineFlagInfo::~CommandLineFlagInfo(&local_100);
              bVar1 = std::operator==("test_bool",&info.name);
              if (!bVar1) {
                pcVar2 = "\"test_bool\"";
                goto LAB_00137f8c;
              }
              bVar1 = std::operator==("bool",&info.type);
              if (!bVar1) {
                pcVar2 = "\"bool\"";
                goto LAB_00137fb7;
              }
              bVar1 = std::operator==("tests bool-ness",&info.description);
              if (!bVar1) {
                pcVar2 = "\"tests bool-ness\"";
                goto LAB_00137fe2;
              }
              bVar1 = std::operator==("false",&info.current_value);
              if (!bVar1) {
                pcVar2 = "\"false\"";
                goto LAB_0013800d;
              }
              bVar1 = std::operator==("false",&info.default_value);
              if (!bVar1) {
                pcVar2 = "\"false\"";
                goto LAB_00138038;
              }
              if (info.is_default == false) goto LAB_00138052;
              if (info.has_validator_fn != true) {
                if ((undefined1 *)info.flag_ptr == &fLB::FLAGS_test_bool) {
                  CommandLineFlagInfo::~CommandLineFlagInfo(&info);
                  FlagSaver::~FlagSaver(&fs);
                  return;
                }
                pcVar2 = "&FLAGS_test_bool";
                goto LAB_0013809b;
              }
              pcVar2 = "!(info.has_validator_fn)";
            }
            fprintf(_stderr,"Check failed: %s\n",pcVar2);
            goto LAB_001380b0;
          }
          pcVar2 = "\"-1\"";
LAB_00138038:
          pcVar3 = "info.default_value";
        }
        else {
          pcVar2 = "\"-1\"";
LAB_0013800d:
          pcVar3 = "info.current_value";
        }
      }
      else {
        pcVar2 = "\"\"";
LAB_00137fe2:
        pcVar3 = "info.description";
      }
    }
    else {
      pcVar2 = "\"int32\"";
LAB_00137fb7:
      pcVar3 = "info.type";
    }
  }
  else {
    pcVar2 = "\"test_int32\"";
LAB_00137f8c:
    pcVar3 = "info.name";
  }
LAB_001380a9:
  fprintf(_stderr,"Check failed: %s %s %s\n",pcVar2,"==",pcVar3);
LAB_001380b0:
  exit(1);
}

Assistant:

TEST(GetCommandLineFlagInfoOrDieTest, FlagExistsAndIsDefault) {
  CommandLineFlagInfo info;
  info = GetCommandLineFlagInfoOrDie("test_int32");
  EXPECT_EQ("test_int32", info.name);
  EXPECT_EQ("int32", info.type);
  EXPECT_EQ("", info.description);
  EXPECT_EQ("-1", info.current_value);
  EXPECT_EQ("-1", info.default_value);
  EXPECT_TRUE(info.is_default);
  EXPECT_EQ(&FLAGS_test_int32, info.flag_ptr);
  info = GetCommandLineFlagInfoOrDie("test_bool");
  EXPECT_EQ("test_bool", info.name);
  EXPECT_EQ("bool", info.type);
  EXPECT_EQ("tests bool-ness", info.description);
  EXPECT_EQ("false", info.current_value);
  EXPECT_EQ("false", info.default_value);
  EXPECT_TRUE(info.is_default);
  EXPECT_FALSE(info.has_validator_fn);
  EXPECT_EQ(&FLAGS_test_bool, info.flag_ptr);
}